

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::coap::CoapTest_CoapMessageHeader_TokenLengthIsTooLong_Test::TestBody
          (CoapTest_CoapMessageHeader_TokenLengthIsTooLong_Test *this)

{
  initializer_list<unsigned_char> __l;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_e0;
  Message local_d8;
  ErrorCode local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  Message local_b0;
  void *local_a8;
  undefined1 local_a0 [16];
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  Error error;
  allocator<unsigned_char> local_46;
  uchar local_45 [13];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_38;
  undefined1 local_28 [8];
  ByteArray buffer;
  CoapTest_CoapMessageHeader_TokenLengthIsTooLong_Test *this_local;
  
  local_45[0] = 'I';
  local_45[1] = 0;
  local_45[2] = 0;
  local_45[3] = 0;
  local_45[4] = 0x11;
  local_45[5] = 0x22;
  local_45[6] = 0x33;
  local_45[7] = 0x44;
  local_45[8] = 0x55;
  local_45[9] = 0x66;
  local_45[10] = 0x77;
  local_45[0xb] = 0x88;
  local_45[0xc] = 0x99;
  local_38._M_allocated_capacity = (size_type)local_45;
  local_38._8_8_ = 0xd;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_char>::allocator(&local_46);
  __l._M_len = local_38._8_8_;
  __l._M_array = (iterator)local_38._M_allocated_capacity;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,__l,&local_46);
  std::allocator<unsigned_char>::~allocator(&local_46);
  Error::Error((Error *)&gtest_ar.message_);
  Message::Deserialize((Message *)local_a0,(Error *)&gtest_ar.message_,(ByteArray *)local_28);
  local_a8 = (void *)0x0;
  testing::internal::EqHelper::
  Compare<std::shared_ptr<ot::commissioner::coap::Message>,_std::nullptr_t,_nullptr>
            ((EqHelper *)local_90,"Message::Deserialize(error, buffer)","nullptr",
             (shared_ptr<ot::commissioner::coap::Message> *)local_a0,&local_a8);
  std::shared_ptr<ot::commissioner::coap::Message>::~shared_ptr
            ((shared_ptr<ot::commissioner::coap::Message> *)local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x97,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_cc = kBadFormat;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_c8,"error","ErrorCode::kBadFormat",(Error *)&gtest_ar.message_,
             &local_cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x98,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  Error::~Error((Error *)&gtest_ar.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  return;
}

Assistant:

TEST(CoapTest, CoapMessageHeader_TokenLengthIsTooLong)
{
    ByteArray buffer{0x49, 0x00, 0x00, 0x00, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88, 0x99};
    Error     error;

    EXPECT_EQ(Message::Deserialize(error, buffer), nullptr);
    EXPECT_EQ(error, ErrorCode::kBadFormat);
}